

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::StreamingReporterBase::testCaseStarting(StreamingReporterBase *this,TestCaseInfo *_testInfo)

{
  Option<Catch::TestCaseInfo> local_f8;
  
  TestCaseInfo::TestCaseInfo((TestCaseInfo *)local_f8.storage,_testInfo);
  local_f8.nullableValue = (TestCaseInfo *)local_f8.storage;
  Option<Catch::TestCaseInfo>::operator=(&this->unusedTestCaseInfo,&local_f8);
  Option<Catch::TestCaseInfo>::reset(&local_f8);
  return;
}

Assistant:

virtual void testCaseStarting( TestCaseInfo const& _testInfo ) {
            unusedTestCaseInfo = _testInfo;
        }